

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O1

void __thiscall
VideoHppGenerator::readRequireType
          (VideoHppGenerator *this,XMLElement *element,ExtensionData *extensionData)

{
  pointer pcVar1;
  pointer pcVar2;
  int line;
  size_type sVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *__n;
  pointer ppXVar11;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_00;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> childElements;
  string name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attributes;
  undefined1 local_1e8 [8];
  XMLElement **ppXStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [2];
  allocator_type local_1ac;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1ab;
  allocator_type local_1aa;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1a9;
  undefined1 local_1a8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  undefined1 local_158 [8];
  undefined1 auStack_150 [24];
  _Base_ptr local_138;
  size_t sStack_130;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  undefined1 local_f8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  
  line = (element->super_XMLNode)._parseLineNum;
  getAttributes_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_98,element);
  auStack_150._16_8_ = auStack_150;
  auStack_150._8_8_ = (_Base_ptr)0x0;
  local_158 = (undefined1  [8])0x0;
  auStack_150._0_8_ = 0;
  sStack_130 = 0;
  local_138 = (_Base_ptr)auStack_150._16_8_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[5],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f8,(char (*) [5])"name",
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_158);
  __l._M_len = 1;
  __l._M_array = (iterator)local_f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)local_1e8,__l,&local_1a9,&local_1aa);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[8],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1a8,(char (*) [8])"comment",
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1a8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)local_128,__l_00,&local_1ab,&local_1ac);
  checkAttributes(line,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_98,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_1e8,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_188);
  pcVar1 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_1e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_d8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_158);
  local_1e8 = (undefined1  [8])0x0;
  ppXStack_1e0 = (XMLElement **)0x0;
  local_1d8[0]._M_allocated_capacity = (_Base_ptr)0x0;
  local_f8._0_8_ = tinyxml2::XMLNode::FirstChildElement(&element->super_XMLNode,(char *)0x0);
  for (; (XMLElement *)local_f8._0_8_ != (XMLElement *)0x0;
      local_f8._0_8_ = tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_f8._0_8_,(char *)0x0))
  {
    if (ppXStack_1e0 == (XMLElement **)local_1d8[0]._0_8_) {
      std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
      _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>> *)
                 local_1e8,(iterator)ppXStack_1e0,(XMLElement **)local_f8);
    }
    else {
      *ppXStack_1e0 = (XMLElement *)local_f8._0_8_;
      ppXStack_1e0 = ppXStack_1e0 + 1;
    }
  }
  local_f8._24_8_ = local_f8 + 8;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_1a8._24_8_ = local_1a8 + 8;
  local_1a8._16_8_ = 0;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (char *)0x0;
  local_188._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_188._M_impl._0_8_ = local_1a8._24_8_;
  local_d8._M_impl._0_8_ = local_f8._24_8_;
  checkElements(line,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                      *)local_1e8,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_f8,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_f8);
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity - (long)local_1e8);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"name","");
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_98,(key_type *)local_1a8);
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f8,*(long *)(iVar7._M_node + 2),
             (long)&(iVar7._M_node[2]._M_parent)->_M_color + *(long *)(iVar7._M_node + 2));
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = local_f8._8_8_;
  local_1a8._8_8_ = local_f8._0_8_;
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,
                     "vk_video/vulkan_video_codec");
  if (bVar5) {
    local_1a8._0_8_ = local_f8._8_8_;
    local_1a8._8_8_ = local_f8._0_8_;
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,".h");
    if (bVar5) {
      sVar3 = (extensionData->depends)._M_string_length;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     "extension <",&extensionData->name);
      local_a0 = &extensionData->name;
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128
                      ,"> already depends on <");
      pcVar2 = auStack_150 + 8;
      local_158 = (undefined1  [8])(pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if (local_158 == (undefined1  [8])paVar10) {
        auStack_150._8_8_ = paVar10->_M_allocated_capacity;
        auStack_150._16_8_ = *(long *)((long)&pbVar9->field_2 + 8);
        local_158 = (undefined1  [8])pcVar2;
      }
      else {
        auStack_150._8_8_ = paVar10->_M_allocated_capacity;
      }
      auStack_150._0_8_ = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_158,(extensionData->name)._M_dataplus._M_p,
                         (extensionData->name)._M_string_length);
      local_1e8 = (undefined1  [8])(pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if (local_1e8 == (undefined1  [8])paVar10) {
        local_1d8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_1d8[0]._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1e8 = (undefined1  [8])local_1d8;
      }
      else {
        local_1d8[0]._0_8_ = paVar10->_M_allocated_capacity;
      }
      ppXStack_1e0 = (XMLElement **)pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8
                      ,">");
      local_1a8._0_8_ = (pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ == paVar10) {
        local_1a8._16_8_ = paVar10->_M_allocated_capacity;
        local_1a8._24_8_ = *(long *)((long)&pbVar9->field_2 + 8);
        local_1a8._0_8_ = pcVar1;
      }
      else {
        local_1a8._16_8_ = paVar10->_M_allocated_capacity;
      }
      local_1a8._8_8_ = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      checkForError(sVar3 == 0,line,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,(ulong)(local_1d8[0]._M_allocated_capacity + 1));
      }
      if (local_158 != (undefined1  [8])pcVar2) {
        operator_delete((void *)local_158,(ulong)(auStack_150._8_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != local_118) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_118[0]._M_allocated_capacity + 1));
      }
      local_158 = (undefined1  [8])pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,".h","");
      local_1e8 = (undefined1  [8])local_1d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e8,local_f8._0_8_,(pointer)(local_f8._8_8_ + local_f8._0_8_));
      auVar4 = local_1e8;
      ppXVar11 = (pointer)((long)ppXStack_1e0 - auStack_150._0_8_);
      if ((ulong)auStack_150._0_8_ <= ppXStack_1e0) {
        if ((pointer)auStack_150._0_8_ != (pointer)0x0) {
          iVar6 = bcmp((char *)((long)ppXStack_1e0 + (long)local_1e8) + -auStack_150._0_8_,
                       (void *)local_158,auStack_150._0_8_);
          if (iVar6 != 0) goto LAB_00110d85;
        }
        *(char *)((long)auVar4 + (long)ppXVar11) = '\0';
        ppXStack_1e0 = ppXVar11;
      }
LAB_00110d85:
      local_128._0_8_ = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"vk_video/","");
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1e8,(pointer)((long)ppXStack_1e0 + (long)local_1e8));
      __n = (char *)local_1a8._8_8_;
      if ((ulong)local_128._8_8_ <= (ulong)local_1a8._8_8_) {
        __n = (char *)local_128._8_8_;
      }
      pcVar2 = auStack_150 + 8;
      if ((ulong)local_128._8_8_ <= (ulong)local_1a8._8_8_) {
        if (__n != (char *)0x0) {
          iVar6 = bcmp((void *)local_1a8._0_8_,(void *)local_128._0_8_,(size_t)__n);
          if (iVar6 != 0) goto LAB_00110e0c;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,0,
                   local_128._8_8_);
      }
LAB_00110e0c:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&extensionData->depends,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != local_118) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_118[0]._M_allocated_capacity + 1));
      }
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,(ulong)(local_1d8[0]._M_allocated_capacity + 1));
      }
      if (local_158 != (undefined1  [8])pcVar2) {
        operator_delete((void *)local_158,(ulong)(auStack_150._8_8_ + 1));
      }
      bVar5 = isExtension(this,&extensionData->depends);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     "extension <",local_a0);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128
                      ,"> uses unknown header <");
      local_158 = (undefined1  [8])(pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if (local_158 == (undefined1  [8])paVar10) {
        auStack_150._8_8_ = paVar10->_M_allocated_capacity;
        auStack_150._16_8_ = *(long *)((long)&pbVar9->field_2 + 8);
        local_158 = (undefined1  [8])pcVar2;
      }
      else {
        auStack_150._8_8_ = paVar10->_M_allocated_capacity;
      }
      auStack_150._0_8_ = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_158,(char *)local_f8._0_8_,local_f8._8_8_);
      local_1e8 = (undefined1  [8])(pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if (local_1e8 == (undefined1  [8])paVar10) {
        local_1d8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_1d8[0]._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1e8 = (undefined1  [8])local_1d8;
      }
      else {
        local_1d8[0]._0_8_ = paVar10->_M_allocated_capacity;
      }
      ppXStack_1e0 = (XMLElement **)pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8
                      ,">");
      local_1a8._0_8_ = (pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ == paVar10) {
        local_1a8._16_8_ = paVar10->_M_allocated_capacity;
        local_1a8._24_8_ = *(long *)((long)&pbVar9->field_2 + 8);
        local_1a8._0_8_ = pcVar1;
      }
      else {
        local_1a8._16_8_ = paVar10->_M_allocated_capacity;
      }
      local_1a8._8_8_ = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      checkForError(bVar5,line,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,(ulong)(local_1d8[0]._M_allocated_capacity + 1));
      }
      if (local_158 != (undefined1  [8])pcVar2) {
        operator_delete((void *)local_158,(ulong)(auStack_150._8_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != local_118) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_118[0]._M_allocated_capacity + 1));
      }
      goto LAB_00110b11;
    }
  }
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
          ::find(&(this->m_types)._M_t,(key_type *)local_f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 "unknown required type <",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8
                      ,">");
  local_1a8._0_8_ = (pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ == paVar10) {
    local_1a8._16_8_ = paVar10->_M_allocated_capacity;
    local_1a8._24_8_ = *(long *)((long)&pbVar9->field_2 + 8);
    local_1a8._0_8_ = pcVar1;
  }
  else {
    local_1a8._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_1a8._8_8_ = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  checkForError((_Rb_tree_header *)iVar8._M_node !=
                &(this->m_types)._M_t._M_impl.super__Rb_tree_header,line,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,(ulong)(local_1d8[0]._M_allocated_capacity + 1));
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&iVar8._M_node[2]._M_parent,&extensionData->name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(extensionData->requireData).types,(value_type *)local_f8);
LAB_00110b11:
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void VideoHppGenerator::readRequireType( tinyxml2::XMLElement const * element, ExtensionData & extensionData )
{
  int                                line       = element->GetLineNum();
  std::map<std::string, std::string> attributes = getAttributes( element );
  checkAttributes( line, attributes, { { "name", {} } }, { { "comment", {} } } );
  checkElements( line, getChildElements( element ), {} );

  std::string name = attributes.find( "name" )->second;
  if ( name.starts_with( "vk_video/vulkan_video_codec" ) && name.ends_with( ".h" ) )
  {
    checkForError( extensionData.depends.empty(), line, "extension <" + extensionData.name + "> already depends on <" + extensionData.name + ">" );
    extensionData.depends = stripPrefix( stripPostfix( name, ".h" ), "vk_video/" );
    checkForError( isExtension( extensionData.depends ), line, "extension <" + extensionData.name + "> uses unknown header <" + name + ">" );
  }
  else
  {
    auto typeIt = m_types.find( name );
    checkForError( typeIt != m_types.end(), line, "unknown required type <" + name + ">" );
    typeIt->second.requiredBy.insert( extensionData.name );
    extensionData.requireData.types.push_back( name );
  }
}